

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O2

int X509_VERIFY_PARAM_set1_policies(X509_VERIFY_PARAM *param,stack_st_ASN1_OBJECT *policies)

{
  uint uVar1;
  stack_st_ASN1_OBJECT *psVar2;
  
  if (param != (X509_VERIFY_PARAM *)0x0) {
    sk_ASN1_OBJECT_pop_free(*(stack_st_ASN1_OBJECT **)&param->purpose,ASN1_OBJECT_free);
    if (policies == (stack_st_ASN1_OBJECT *)0x0) {
      param->purpose = 0;
      param->trust = 0;
      uVar1 = 1;
    }
    else {
      psVar2 = sk_ASN1_OBJECT_deep_copy((stack_st_ASN1_OBJECT *)policies,OBJ_dup,ASN1_OBJECT_free);
      *(stack_st_ASN1_OBJECT **)&param->purpose = psVar2;
      uVar1 = (uint)(psVar2 != (stack_st_ASN1_OBJECT *)0x0);
    }
    return uVar1;
  }
  return 0;
}

Assistant:

int X509_VERIFY_PARAM_set1_policies(X509_VERIFY_PARAM *param,
                                    const STACK_OF(ASN1_OBJECT) *policies) {
  if (!param) {
    return 0;
  }

  sk_ASN1_OBJECT_pop_free(param->policies, ASN1_OBJECT_free);
  if (!policies) {
    param->policies = NULL;
    return 1;
  }

  param->policies =
      sk_ASN1_OBJECT_deep_copy(policies, OBJ_dup, ASN1_OBJECT_free);
  if (!param->policies) {
    return 0;
  }

  return 1;
}